

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotations.cpp
# Opt level: O3

string * __thiscall
snestistics::AnnotationResolver::data_label
          (string *__return_storage_ptr__,AnnotationResolver *this,Pointer p,string *use_comment,
          bool force)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_t sVar2;
  char t [7];
  char local_47 [7];
  string local_40;
  
  if ((use_comment != (string *)0x0) && (use_comment->_M_string_length != 0)) {
    __assert_fail("!use_comment || use_comment->empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/breakin[P]snestistics/source/annotations.cpp"
                  ,0x231,
                  "std::string snestistics::AnnotationResolver::data_label(const Pointer, std::string *, const bool) const"
                 );
  }
  paVar1 = &local_40.field_2;
  local_40._M_string_length = 0;
  local_40.field_2._M_local_buf[0] = '\0';
  local_40._M_dataplus._M_p = (pointer)paVar1;
  line_info(this,p,&local_40,(string *)0x0,use_comment,false);
  if (local_40._M_string_length == 0 && force) {
    sprintf(local_47,"data_%0X",(ulong)p);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    sVar2 = strlen(local_47);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,local_47,local_47 + sVar2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != paVar1) {
      operator_delete(local_40._M_dataplus._M_p);
    }
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p == paVar1) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(local_40.field_2._M_allocated_capacity._1_7_,local_40.field_2._M_local_buf[0]);
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_40.field_2._8_8_;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = local_40._M_dataplus._M_p;
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(local_40.field_2._M_allocated_capacity._1_7_,local_40.field_2._M_local_buf[0]);
    }
    __return_storage_ptr__->_M_string_length = local_40._M_string_length;
  }
  return __return_storage_ptr__;
}

Assistant:

std::string AnnotationResolver::data_label(const Pointer p, std::string * use_comment, const bool force) const {
	assert(!use_comment || use_comment->empty());
	std::string l;
	line_info(p, &l, nullptr, use_comment, false);
	if (!l.empty() || !force)
		return l;
	char t[7];
	sprintf(t, "data_%0X", p);
	return std::string(t);
}